

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

ostream * libDAI::operator<<(ostream *os,TFactor<double> *P)

{
  ostream *poVar1;
  size_t sVar2;
  TFactor<double> *in_RSI;
  ostream *in_RDI;
  double dVar3;
  size_t i;
  size_t in_stack_ffffffffffffffc8;
  VarSet *in_stack_ffffffffffffffe8;
  ulong uVar4;
  ulong uVar5;
  
  std::operator<<(in_RDI,"(");
  TFactor<double>::vars(in_RSI);
  poVar1 = operator<<((ostream *)in_RSI,in_stack_ffffffffffffffe8);
  std::operator<<(poVar1," <");
  uVar4 = 0;
  while( true ) {
    uVar5 = uVar4;
    sVar2 = TProb<double>::size((TProb<double> *)0x88023b);
    if (sVar2 <= uVar4) break;
    poVar1 = in_RDI;
    dVar3 = TProb<double>::operator[]((TProb<double> *)in_RDI,in_stack_ffffffffffffffc8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
    std::operator<<(poVar1," ");
    uVar4 = uVar5 + 1;
  }
  std::operator<<(in_RDI,">)");
  return in_RDI;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const TFactor<T>& P) {
        os << "(" << P.vars() << " <";
        for( size_t i = 0; i < P._p.size(); i++ )
            os << P._p[i] << " ";
        os << ">)";
        return os;
    }